

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::passing::~passing(passing *this)

{
  void *in_RDI;
  
  ~passing((passing *)0x12ef58);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}